

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedatabase.cpp
# Opt level: O0

QString * __thiscall QMimeDatabasePrivate::genericIcon(QMimeDatabasePrivate *this,QString *name)

{
  bool bVar1;
  pointer pQVar2;
  undefined8 in_RDX;
  QString *in_RDI;
  long in_FS_OFFSET;
  unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_> *provider;
  Providers *__range1;
  QString *genericIconName;
  const_iterator __end1;
  const_iterator __begin1;
  QMutexLocker<QMutex> locker;
  __normal_iterator<const_std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>_*,_std::vector<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>,_std::allocator<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>_>_>_>
  *in_stack_ffffffffffffff68;
  QMimeDatabasePrivate *in_stack_ffffffffffffff70;
  __normal_iterator<const_std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>_*,_std::vector<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>,_std::allocator<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>_>_>_>
  local_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  QMutexLocker<QMutex>::QMutexLocker
            ((QMutexLocker<QMutex> *)in_stack_ffffffffffffff70,(QMutex *)in_stack_ffffffffffffff68);
  providers(in_stack_ffffffffffffff70);
  local_20._M_current =
       (unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_> *)
       &DAT_aaaaaaaaaaaaaaaa;
  local_20._M_current =
       (unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_> *)
       std::
       vector<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>,_std::allocator<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>_>_>
       ::begin((vector<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>,_std::allocator<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>_>_>
                *)in_stack_ffffffffffffff70);
  std::
  vector<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>,_std::allocator<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>_>_>
  ::end((vector<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>,_std::allocator<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>_>_>
         *)in_stack_ffffffffffffff70);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>_*,_std::vector<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>,_std::allocator<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>_>_>_>
                             *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68), bVar1) {
    in_stack_ffffffffffffff70 = (QMimeDatabasePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>_*,_std::vector<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>,_std::allocator<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>_>_>_>
    ::operator*(&local_20);
    (in_RDI->d).size = (qsizetype)in_stack_ffffffffffffff70;
    (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>::operator->
                       ((unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_> *)
                        0x8e3ab7);
    (*pQVar2->_vptr_QMimeProviderBase[0xf])(in_RDI,pQVar2,in_RDX);
    bVar1 = QString::isEmpty((QString *)0x8e3ad9);
    if (!bVar1) goto LAB_008e3b53;
    QString::~QString((QString *)0x8e3b26);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>_*,_std::vector<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>,_std::allocator<std::unique_ptr<QMimeProviderBase,_std::default_delete<QMimeProviderBase>_>_>_>_>
    ::operator++(&local_20);
  }
  QString::QString((QString *)0x8e3b4b);
LAB_008e3b53:
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)in_stack_ffffffffffffff70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QMimeDatabasePrivate::genericIcon(const QString &name)
{
    QMutexLocker locker(&mutex);
    for (const auto &provider : providers()) {
        QString genericIconName = provider->genericIcon(name);
        if (!genericIconName.isEmpty())
            return genericIconName;
    }
    return {};
}